

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_bpf2_get_heap_size(ma_bpf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  uint uVar1;
  ma_result mVar2;
  double __x;
  
  __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
  sin(__x);
  sin(1.5707963267948966 - __x);
  mVar2 = MA_INVALID_ARGS;
  if (pHeapSizeInBytes != (size_t *)0x0) {
    uVar1 = pConfig->channels;
    *pHeapSizeInBytes = 0;
    if ((ulong)uVar1 != 0) {
      *pHeapSizeInBytes = (ulong)uVar1 << 3;
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_bpf2_get_heap_size(const ma_bpf2_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_biquad_config bqConfig;
    bqConfig = ma_bpf2__get_biquad_config(pConfig);

    return ma_biquad_get_heap_size(&bqConfig, pHeapSizeInBytes);
}